

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcrypt.c
# Opt level: O1

void bcrypt_genblock(int counter,uchar *hashed_passphrase,uchar *salt,int saltbytes,uchar *output)

{
  ssh_hash *psVar1;
  uchar hashed_salt [64];
  uchar auStack_78 [72];
  
  psVar1 = sha512_select(&ssh_sha512);
  if (psVar1 != (ssh_hash *)0x0) {
    (*psVar1->vt->reset)(psVar1);
  }
  BinarySink_put_data(psVar1->binarysink_,salt,(long)saltbytes);
  if (counter != 0) {
    BinarySink_put_uint32(psVar1->binarysink_,(long)counter);
  }
  (*psVar1->vt->digest)(psVar1,auStack_78);
  (*psVar1->vt->free)(psVar1);
  bcrypt_hash(hashed_passphrase,0x40,auStack_78,0x40,output);
  smemclr(auStack_78,0x40);
  return;
}

Assistant:

void bcrypt_genblock(int counter,
                     const unsigned char hashed_passphrase[64],
                     const unsigned char *salt, int saltbytes,
                     unsigned char output[32])
{
    unsigned char hashed_salt[64];

    /* Hash the input salt with the counter value optionally suffixed
     * to get our real 32-byte salt */
    ssh_hash *h = ssh_hash_new(&ssh_sha512);
    put_data(h, salt, saltbytes);
    if (counter)
        put_uint32(h, counter);
    ssh_hash_final(h, hashed_salt);

    bcrypt_hash(hashed_passphrase, 64, hashed_salt, 64, output);

    smemclr(&hashed_salt, sizeof(hashed_salt));
}